

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common_v2.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::Finalize(idx2_file_v2 *Idx2)

{
  bool bVar1;
  error<idx2::idx2_err_code> eVar2;
  idx2_file_v2 *local_a8;
  undefined2 local_a0;
  bool bStack_9e;
  anon_class_1_0_00000001 local_91;
  idx2_file_v2 *local_90;
  undefined2 local_88;
  bool bStack_86;
  anon_class_8_1_32d6a57b local_80;
  error<idx2::idx2_err_code> local_78;
  undefined1 local_68 [8];
  error<idx2::idx2_err_code> Result_1;
  undefined2 local_50;
  bool bStack_4e;
  anon_class_8_1_32d6a57b local_48;
  error<idx2::idx2_err_code> local_40;
  undefined1 local_30 [8];
  error<idx2::idx2_err_code> Result;
  idx2_file_v2 *Idx2_local;
  undefined2 local_10;
  undefined1 uStack_e;
  undefined5 uStack_d;
  
  Result._8_8_ = Idx2;
  eVar2 = CheckDimensions(Idx2);
  local_40.Msg = eVar2.Msg;
  local_30 = (undefined1  [8])local_40.Msg;
  local_40._8_2_ = eVar2._8_2_;
  Result.Msg._0_1_ = local_40.Code;
  Result.Msg._1_1_ = local_40.StackIdx;
  local_40.StrGened = eVar2.StrGened;
  Result.Msg._2_1_ = local_40.StrGened;
  local_40 = eVar2;
  bVar1 = error::operator_cast_to_bool((error *)local_30);
  if (bVar1) {
    eVar2 = ParseIndexingTemplate((idx2_file_v2 *)Result._8_8_);
    local_78.Msg = eVar2.Msg;
    local_68 = (undefined1  [8])local_78.Msg;
    local_78._8_2_ = eVar2._8_2_;
    Result_1.Msg._0_1_ = local_78.Code;
    Result_1.Msg._1_1_ = local_78.StackIdx;
    local_78.StrGened = eVar2.StrGened;
    Result_1.Msg._2_1_ = local_78.StrGened;
    local_78 = eVar2;
    bVar1 = error::operator_cast_to_bool((error *)local_68);
    if (bVar1) {
      eVar2 = Finalize::anon_class_1_0_00000001::operator()(&local_91);
      local_a8 = (idx2_file_v2 *)eVar2.Msg;
      Idx2_local = local_a8;
      local_a0 = eVar2._8_2_;
      local_10 = local_a0;
      bStack_9e = eVar2.StrGened;
      uStack_e = bStack_9e;
    }
    else {
      local_80.Result = (error<idx2::idx2_err_code> *)local_68;
      eVar2 = Finalize::anon_class_8_1_32d6a57b::operator()(&local_80);
      local_90 = (idx2_file_v2 *)eVar2.Msg;
      Idx2_local = local_90;
      local_88 = eVar2._8_2_;
      local_10 = local_88;
      bStack_86 = eVar2.StrGened;
      uStack_e = bStack_86;
    }
  }
  else {
    local_48.Result = (error<idx2::idx2_err_code> *)local_30;
    eVar2 = Finalize::anon_class_8_1_32d6a57b::operator()(&local_48);
    Result_1._8_8_ = eVar2.Msg;
    Idx2_local = (idx2_file_v2 *)Result_1._8_8_;
    local_50 = eVar2._8_2_;
    local_10 = local_50;
    bStack_4e = eVar2.StrGened;
    uStack_e = bStack_4e;
  }
  eVar2.Code = (undefined1)local_10;
  eVar2.StackIdx = local_10._1_1_;
  eVar2.Msg = (cstr)Idx2_local;
  eVar2.StrGened = (bool)uStack_e;
  eVar2._11_5_ = uStack_d;
  return eVar2;
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file_v2* Idx2)
{
  idx2_PropagateIfError(CheckDimensions(Idx2));
  idx2_PropagateIfError(ParseIndexingTemplate(Idx2));
  /* print the parsed indexing template */

  return idx2_Error(idx2_err_code::NoError);
}